

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void CTcSymLocal::s_gen_code_setlcl_stk(int var_num,int is_param)

{
  size_t in_RCX;
  void *__buf;
  
  if (var_num < 0x100) {
    CTcGenTarg::write_op(G_cg,(is_param != 0) * '\x02' + 0xe0);
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)var_num,__buf,in_RCX);
  }
  else {
    CTcGenTarg::write_op(G_cg,(is_param != 0) * '\x02' + 0xe1);
    CTcDataStream::write2(&G_cs->super_CTcDataStream,var_num);
  }
  G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  return;
}

Assistant:

void CTcSymLocal::s_gen_code_setlcl_stk(int var_num, int is_param)
{
    /* use the shortest form that will fit our variable index */
    if (var_num <= 255)
    {
        /* use the one-byte instruction */
        G_cg->write_op(is_param ? OPC_SETARG1 : OPC_SETLCL1);
        G_cs->write((char)var_num);
    }
    else
    {
        /* big number - use the two-byte instruction */
        G_cg->write_op(is_param ? OPC_SETARG2 : OPC_SETLCL2);
        G_cs->write2(var_num);
    }

    /* the setarg/setlcl ops remove the rvalue */
    G_cg->note_pop();
}